

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupMarked(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  Gia_Obj_t *pGVar8;
  Gia_Man_t *p_00;
  uint *puVar9;
  char *pcVar10;
  Gia_Obj_t *pGVar11;
  ulong uVar12;
  Gia_Rpr_t *pGVar13;
  ulong uVar14;
  int *piVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  int local_44;
  
  iVar19 = 0;
  iVar18 = 0;
  while ((iVar18 < p->nObjs && (pGVar8 = Gia_ManObj(p,iVar18), pGVar8 != (Gia_Obj_t *)0x0))) {
    iVar19 = iVar19 + (uint)((*(uint *)pGVar8 >> 0x1e & 1) != 0);
    iVar18 = iVar18 + 1;
  }
  Gia_ManFillValue(p);
  p_00 = Gia_ManStart(p->nObjs - iVar19);
  if (p->pMuxes != (uint *)0x0) {
    puVar9 = (uint *)calloc((long)p_00->nObjsAlloc,4);
    p_00->pMuxes = puVar9;
  }
  p_00->nConstrs = p->nConstrs;
  pcVar10 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar10;
  pcVar10 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar10;
  p->pObjs->Value = 0;
  iVar18 = 1;
  iVar19 = 0;
  local_44 = 0;
  do {
    if ((p->nObjs <= iVar18) || (pGVar8 = Gia_ManObj(p,iVar18), pGVar8 == (Gia_Obj_t *)0x0)) {
      if (p_00->nObjsAlloc != p_00->nObjs) {
        __assert_fail("pNew->nObjsAlloc == pNew->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                      ,0x446,"Gia_Man_t *Gia_ManDupMarked(Gia_Man_t *)");
      }
      if (iVar19 != local_44) {
        __assert_fail("nRos == nRis",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                      ,0x447,"Gia_Man_t *Gia_ManDupMarked(Gia_Man_t *)");
      }
      Gia_ManSetRegNum(p_00,iVar19);
      if ((p->pReprs != (Gia_Rpr_t *)0x0) && (p->pNexts != (int *)0x0)) {
        pGVar13 = (Gia_Rpr_t *)calloc((long)p_00->nObjs,4);
        p_00->pReprs = pGVar13;
        for (lVar16 = 0; uVar14 = (ulong)p->nObjs, lVar16 < (long)uVar14; lVar16 = lVar16 + 1) {
          p_00->pReprs[lVar16] = (Gia_Rpr_t)((uint)p_00->pReprs[lVar16] | 0xfffffff);
        }
        lVar16 = 1;
        while ((lVar16 < (int)uVar14 &&
               (pGVar8 = Gia_ManObj(p,(int)lVar16), pGVar8 != (Gia_Obj_t *)0x0))) {
          if ((pGVar8->Value != 0xffffffff) &&
             (((uVar2 = (uint)p->pReprs[lVar16] & 0xfffffff, uVar2 != 0xfffffff &&
               (pGVar11 = Gia_ManObj(p,uVar2), pGVar11 != (Gia_Obj_t *)0x0)) &&
              (pGVar11->Value != 0xffffffff)))) {
            iVar18 = Gia_ObjIsBuf(pGVar8);
            if (iVar18 != 0) {
              __assert_fail("!Gia_ObjIsBuf(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                            ,0x458,"Gia_Man_t *Gia_ManDupMarked(Gia_Man_t *)");
            }
            iVar18 = Abc_Lit2Var(pGVar8->Value);
            iVar19 = Abc_Lit2Var(pGVar11->Value);
            if (iVar18 != iVar19) {
              iVar18 = Abc_Lit2Var(pGVar8->Value);
              iVar19 = Abc_Lit2Var(pGVar11->Value);
              Gia_ObjSetRepr(p_00,iVar18,iVar19);
            }
          }
          lVar16 = lVar16 + 1;
          uVar14 = (ulong)(uint)p->nObjs;
        }
        piVar15 = Gia_ManDeriveNexts(p_00);
        p_00->pNexts = piVar15;
      }
      if (p->pSibls != (int *)0x0) {
        piVar15 = (int *)calloc((long)p_00->nObjs,4);
        p_00->pSibls = piVar15;
        for (iVar18 = 1; iVar18 < p->nObjs; iVar18 = iVar18 + 1) {
          pGVar8 = Gia_ManObj(p,iVar18);
          if (pGVar8 == (Gia_Obj_t *)0x0) {
            return p_00;
          }
          if (((pGVar8->Value != 0xffffffff) &&
              (pGVar11 = Gia_ObjSiblObj(p,iVar18), pGVar11 != (Gia_Obj_t *)0x0)) &&
             (pGVar11->Value != 0xffffffff)) {
            iVar19 = Gia_ObjIsBuf(pGVar8);
            if (iVar19 != 0) {
              __assert_fail("!Gia_ObjIsBuf(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                            ,0x46b,"Gia_Man_t *Gia_ManDupMarked(Gia_Man_t *)");
            }
            uVar2 = Abc_Lit2Var(pGVar8->Value);
            uVar6 = Abc_Lit2Var(pGVar11->Value);
            if (uVar2 <= uVar6) {
              __assert_fail("Abc_Lit2Var(pObj->Value) > Abc_Lit2Var(pSibl->Value)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                            ,0x46c,"Gia_Man_t *Gia_ManDupMarked(Gia_Man_t *)");
            }
            iVar19 = Abc_Lit2Var(pGVar11->Value);
            piVar15 = p_00->pSibls;
            uVar2 = Abc_Lit2Var(pGVar8->Value);
            piVar15[uVar2] = iVar19;
          }
        }
      }
      return p_00;
    }
    uVar14 = *(ulong *)pGVar8;
    iVar1 = Gia_ObjIsBuf(pGVar8);
    uVar2 = (uint)uVar14;
    if ((uVar2 >> 0x1e & 1) == 0) {
      if (iVar1 == 0) {
        if ((uVar14 & 0x1fffffff) == 0x1fffffff || (int)uVar2 < 0) {
          if ((~uVar2 & 0x9fffffff) == 0) {
            uVar2 = Gia_ManAppendCi(p_00);
            pGVar8->Value = uVar2;
            iVar1 = Gia_ObjIsRo(p,pGVar8);
            iVar19 = iVar19 + iVar1;
          }
          else if ((int)uVar2 < 0 && (int)(uVar14 & 0x1fffffff) != 0x1fffffff) {
            iVar1 = Gia_ObjFanin0Copy(pGVar8);
            uVar2 = Gia_ManAppendCo(p_00,iVar1);
            pGVar8->Value = uVar2;
            iVar1 = Gia_ObjIsRi(p,pGVar8);
            local_44 = local_44 + iVar1;
          }
        }
        else {
          if ((uVar2 & 0x1fffffff) < ((uint)(uVar14 >> 0x20) & 0x1fffffff)) {
            iVar1 = Gia_ObjFanin0Copy(pGVar8);
            iVar3 = Gia_ObjFanin1Copy(pGVar8);
            pGVar11 = Gia_ManAppendObj(p_00);
            iVar4 = Abc_Lit2Var(iVar1);
            if (p_00->nObjs <= iVar4) {
              __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x296,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
            }
            iVar4 = Abc_Lit2Var(iVar3);
            if (p_00->nObjs <= iVar4) {
              __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x297,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
            }
            iVar4 = Abc_Lit2Var(iVar1);
            iVar5 = Abc_Lit2Var(iVar3);
            if (iVar4 == iVar5) {
              __assert_fail("Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x298,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
            }
            iVar4 = Abc_LitIsCompl(iVar1);
            if (iVar4 != 0) {
              __assert_fail("!Abc_LitIsCompl(iLit0)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x299,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
            }
            iVar4 = Abc_LitIsCompl(iVar3);
            if (iVar4 != 0) {
              __assert_fail("!Abc_LitIsCompl(iLit1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x29a,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
            }
            uVar2 = Abc_Lit2Var(iVar1);
            uVar6 = Abc_Lit2Var(iVar3);
            iVar4 = Gia_ObjId(p_00,pGVar11);
            iVar5 = Abc_Lit2Var(iVar1);
            uVar14 = (ulong)(iVar4 - iVar5 & 0x1fffffff);
            if (uVar6 < uVar2) {
              *(ulong *)pGVar11 = *(ulong *)pGVar11 & 0xffffffffe0000000 | uVar14;
              iVar1 = Abc_LitIsCompl(iVar1);
              *(ulong *)pGVar11 =
                   *(ulong *)pGVar11 & 0xffffffffdfffffff | (ulong)(uint)(iVar1 << 0x1d);
              iVar1 = Gia_ObjId(p_00,pGVar11);
              iVar4 = Abc_Lit2Var(iVar3);
              *(ulong *)pGVar11 =
                   *(ulong *)pGVar11 & 0xe0000000ffffffff |
                   (ulong)(iVar1 - iVar4 & 0x1fffffff) << 0x20;
              uVar2 = Abc_LitIsCompl(iVar3);
              uVar12 = (ulong)uVar2 << 0x3d;
              uVar14 = *(ulong *)pGVar11;
              uVar17 = 0xdfffffffffffffff;
            }
            else {
              *(ulong *)pGVar11 = *(ulong *)pGVar11 & 0xe0000000ffffffff | uVar14 << 0x20;
              uVar2 = Abc_LitIsCompl(iVar1);
              *(ulong *)pGVar11 = *(ulong *)pGVar11 & 0xdfffffffffffffff | (ulong)uVar2 << 0x3d;
              iVar1 = Gia_ObjId(p_00,pGVar11);
              iVar4 = Abc_Lit2Var(iVar3);
              *(ulong *)pGVar11 =
                   *(ulong *)pGVar11 & 0xffffffffe0000000 | (ulong)(iVar1 - iVar4 & 0x1fffffff);
              iVar1 = Abc_LitIsCompl(iVar3);
              uVar12 = (ulong)(uint)(iVar1 << 0x1d);
              uVar14 = *(ulong *)pGVar11;
              uVar17 = 0xffffffffdfffffff;
            }
            *(ulong *)pGVar11 = uVar14 & uVar17 | uVar12;
            p_00->nXors = p_00->nXors + 1;
          }
          else {
            iVar1 = Gia_ObjId(p,pGVar8);
            puVar9 = p->pMuxes;
            if ((puVar9 == (uint *)0x0) || (puVar9[iVar1] == 0)) {
              iVar1 = Gia_ObjFanin0Copy(pGVar8);
              iVar3 = Gia_ObjFanin1Copy(pGVar8);
              uVar2 = Gia_ManAppendAnd(p_00,iVar1,iVar3);
              goto LAB_005520e5;
            }
            iVar1 = Gia_ObjId(p,pGVar8);
            iVar1 = Abc_Lit2Var(puVar9[iVar1]);
            pGVar11 = Gia_ManObj(p,iVar1);
            puVar9 = p->pMuxes;
            uVar2 = pGVar11->Value;
            if (puVar9 == (uint *)0x0) {
              iVar1 = 0;
            }
            else {
              iVar1 = Gia_ObjId(p,pGVar8);
              iVar1 = Abc_LitIsCompl(puVar9[iVar1]);
            }
            uVar2 = Abc_LitNotCond(uVar2,iVar1);
            iVar1 = Gia_ObjFanin1Copy(pGVar8);
            iVar3 = Gia_ObjFanin0Copy(pGVar8);
            pGVar11 = Gia_ManAppendObj(p_00);
            if (p_00->pMuxes == (uint *)0x0) {
              __assert_fail("p->pMuxes != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x2af,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
            }
            iVar4 = Abc_Lit2Var(iVar3);
            if (p_00->nObjs <= iVar4) {
              __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x2b0,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
            }
            iVar4 = Abc_Lit2Var(iVar1);
            if (p_00->nObjs <= iVar4) {
              __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x2b1,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
            }
            iVar4 = Abc_Lit2Var(uVar2);
            if (p_00->nObjs <= iVar4) {
              __assert_fail("iLitC >= 0 && Abc_Lit2Var(iLitC) < Gia_ManObjNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x2b2,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
            }
            iVar4 = Abc_Lit2Var(iVar3);
            iVar5 = Abc_Lit2Var(iVar1);
            if (iVar4 == iVar5) {
              __assert_fail("Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x2b3,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
            }
            iVar4 = Abc_Lit2Var(uVar2);
            iVar5 = Abc_Lit2Var(iVar3);
            if (iVar4 == iVar5) {
              __assert_fail("Abc_Lit2Var(iLitC) != Abc_Lit2Var(iLit0)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x2b4,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
            }
            iVar4 = Abc_Lit2Var(uVar2);
            iVar5 = Abc_Lit2Var(iVar1);
            if (iVar4 == iVar5) {
              __assert_fail("Abc_Lit2Var(iLitC) != Abc_Lit2Var(iLit1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x2b5,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
            }
            if ((p_00->pHTable != (int *)0x0) && (iVar4 = Abc_LitIsCompl(iVar1), iVar4 != 0)) {
              __assert_fail("!p->pHTable || !Abc_LitIsCompl(iLit1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x2b6,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
            }
            uVar6 = Abc_Lit2Var(iVar3);
            uVar7 = Abc_Lit2Var(iVar1);
            iVar4 = Gia_ObjId(p_00,pGVar11);
            iVar5 = Abc_Lit2Var(iVar3);
            uVar14 = (ulong)(iVar4 - iVar5 & 0x1fffffff);
            if (uVar6 < uVar7) {
              *(ulong *)pGVar11 = *(ulong *)pGVar11 & 0xffffffffe0000000 | uVar14;
              iVar3 = Abc_LitIsCompl(iVar3);
              *(ulong *)pGVar11 =
                   *(ulong *)pGVar11 & 0xffffffffdfffffff | (ulong)(uint)(iVar3 << 0x1d);
              iVar3 = Gia_ObjId(p_00,pGVar11);
              iVar4 = Abc_Lit2Var(iVar1);
              *(ulong *)pGVar11 =
                   *(ulong *)pGVar11 & 0xe0000000ffffffff |
                   (ulong)(iVar3 - iVar4 & 0x1fffffff) << 0x20;
              uVar6 = Abc_LitIsCompl(iVar1);
              *(ulong *)pGVar11 = *(ulong *)pGVar11 & 0xdfffffffffffffff | (ulong)uVar6 << 0x3d;
            }
            else {
              *(ulong *)pGVar11 = *(ulong *)pGVar11 & 0xe0000000ffffffff | uVar14 << 0x20;
              uVar6 = Abc_LitIsCompl(iVar3);
              *(ulong *)pGVar11 = *(ulong *)pGVar11 & 0xdfffffffffffffff | (ulong)uVar6 << 0x3d;
              iVar3 = Gia_ObjId(p_00,pGVar11);
              iVar4 = Abc_Lit2Var(iVar1);
              *(ulong *)pGVar11 =
                   *(ulong *)pGVar11 & 0xffffffffe0000000 | (ulong)(iVar3 - iVar4 & 0x1fffffff);
              iVar1 = Abc_LitIsCompl(iVar1);
              *(ulong *)pGVar11 =
                   *(ulong *)pGVar11 & 0xffffffffdfffffff | (ulong)(uint)(iVar1 << 0x1d);
              uVar2 = Abc_LitNot(uVar2);
            }
            puVar9 = p_00->pMuxes;
            iVar1 = Gia_ObjId(p_00,pGVar11);
            puVar9[iVar1] = uVar2;
            p_00->nMuxes = p_00->nMuxes + 1;
          }
          iVar1 = Gia_ObjId(p_00,pGVar11);
          pGVar8->Value = iVar1 * 2;
        }
      }
      else {
        iVar1 = Gia_ObjFanin0Copy(pGVar8);
        uVar2 = Gia_ManAppendBuf(p_00,iVar1);
LAB_005520e5:
        pGVar8->Value = uVar2;
      }
    }
    else {
      if (iVar1 != 0) {
        __assert_fail("!Gia_ObjIsBuf(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                      ,0x42b,"Gia_Man_t *Gia_ManDupMarked(Gia_Man_t *)");
      }
      *(ulong *)pGVar8 = uVar14 & 0xffffffffbfffffff;
    }
    iVar18 = iVar18 + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManDupMarked( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i, nRos = 0, nRis = 0;
    int CountMarked = 0;
    Gia_ManForEachObj( p, pObj, i )
        CountMarked += pObj->fMark0;
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) - CountMarked );
    if ( p->pMuxes )
        pNew->pMuxes = ABC_CALLOC( unsigned, pNew->nObjsAlloc );
    pNew->nConstrs = p->nConstrs;
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( pObj->fMark0 )
        {
            assert( !Gia_ObjIsBuf(pObj) );
            pObj->fMark0 = 0;
            continue;
        }
        if ( Gia_ObjIsBuf(pObj) )
            pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsAnd(pObj) )
        {
            if ( Gia_ObjIsXor(pObj) )
                pObj->Value = Gia_ManAppendXorReal( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
            else if ( Gia_ObjIsMux(p, pObj) )
                pObj->Value = Gia_ManAppendMuxReal( pNew, Gia_ObjFanin2Copy(p, pObj), Gia_ObjFanin1Copy(pObj), Gia_ObjFanin0Copy(pObj) );
            else
                pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        }
        else if ( Gia_ObjIsCi(pObj) )
        {
            pObj->Value = Gia_ManAppendCi( pNew );
            nRos += Gia_ObjIsRo(p, pObj);
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
//            Gia_Obj_t * pFanin = Gia_ObjFanin0(pObj);
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
            nRis += Gia_ObjIsRi(p, pObj);
        }
    }
    assert( pNew->nObjsAlloc == pNew->nObjs );
    assert( nRos == nRis );
    Gia_ManSetRegNum( pNew, nRos );
    if ( p->pReprs && p->pNexts )
    {
        Gia_Obj_t * pRepr;
        pNew->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(pNew) );
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
            Gia_ObjSetRepr( pNew, i, GIA_VOID );
        Gia_ManForEachObj1( p, pObj, i )
        {
            if ( !~pObj->Value )
                continue;
            pRepr = Gia_ObjReprObj( p, i );
            if ( pRepr == NULL )
                continue;
            if ( !~pRepr->Value )
                continue;
            assert( !Gia_ObjIsBuf(pObj) );
            if ( Abc_Lit2Var(pObj->Value) != Abc_Lit2Var(pRepr->Value) )
                Gia_ObjSetRepr( pNew, Abc_Lit2Var(pObj->Value), Abc_Lit2Var(pRepr->Value) ); 
        }
        pNew->pNexts = Gia_ManDeriveNexts( pNew );
    }
    if ( Gia_ManHasChoices(p) )
    {
        Gia_Obj_t * pSibl;
        pNew->pSibls = ABC_CALLOC( int, Gia_ManObjNum(pNew) );
        Gia_ManForEachObj1( p, pObj, i )
        {
            if ( !~pObj->Value )
                continue;
            pSibl = Gia_ObjSiblObj( p, i );
            if ( pSibl == NULL )
                continue;
            if ( !~pSibl->Value )
                continue;
            assert( !Gia_ObjIsBuf(pObj) );
            assert( Abc_Lit2Var(pObj->Value) > Abc_Lit2Var(pSibl->Value) );
            pNew->pSibls[Abc_Lit2Var(pObj->Value)] = Abc_Lit2Var(pSibl->Value);
        }
    }
    return pNew;
}